

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O1

result<toml::basic_value<toml::type_config>,_toml::error_info> *
toml::detail::parse_null<toml::type_config>
          (result<toml::basic_value<toml::type_config>,_toml::error_info> *__return_storage_ptr__,
          location *loc,context<toml::type_config> *ctx)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  basic_value<toml::type_config> *v;
  basic_value<toml::type_config> *pbVar4;
  region reg;
  string local_490;
  string local_470;
  string local_450;
  string local_430;
  literal local_410;
  undefined1 local_3f8 [48];
  size_t local_3c8;
  undefined1 *puStack_3c0;
  size_t local_3b8;
  _Alloc_hider _Stack_3b0;
  size_t local_3a8;
  size_t sStack_3a0;
  size_t local_398;
  undefined1 local_390 [16];
  undefined1 local_380 [16];
  undefined1 local_370 [72];
  undefined1 local_328 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_318;
  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_308;
  undefined8 local_2f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e0;
  _Alloc_hider local_2d0;
  size_type local_2c8;
  undefined1 local_2c0 [80];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_270;
  _Alloc_hider local_268;
  location local_260;
  source_location local_218;
  basic_value<toml::type_config> local_1a0;
  failure<toml::error_info> local_d8;
  failure<toml::error_info> local_80;
  
  if ((ctx->toml_spec_).ext_null_value == false) {
    local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_430,
               "toml::parse_null: invalid spec: spec.ext_null_value must be true.","");
    region::region((region *)local_328,loc);
    source_location::source_location(&local_218,(region *)local_328);
    local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_450,"here","");
    make_error_info<>((error_info *)local_390,&local_430,&local_218,&local_450);
    err<toml::error_info>(&local_80,(error_info *)local_390);
    __return_storage_ptr__->is_ok_ = false;
    failure<toml::error_info>::failure
              ((failure<toml::error_info> *)&(__return_storage_ptr__->field_1).succ_,&local_80);
    failure<toml::error_info>::~failure(&local_80);
    if ((undefined1 *)local_370._24_8_ != local_370 + 0x28) {
      operator_delete((void *)local_370._24_8_,(ulong)(local_370._40_8_ + 1));
    }
    std::
    vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_370);
    if ((element_type *)local_390._0_8_ != (element_type *)local_380) {
      operator_delete((void *)local_390._0_8_,(ulong)(local_380._0_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_450._M_dataplus._M_p != &local_450.field_2) {
      operator_delete(local_450._M_dataplus._M_p,local_450.field_2._M_allocated_capacity + 1);
    }
    source_location::~source_location(&local_218);
    region::~region((region *)local_328);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_430._M_dataplus._M_p != &local_430.field_2) {
      operator_delete(local_430._M_dataplus._M_p,local_430.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    local_328._0_8_ = &PTR__scanner_base_005688e0;
    local_328._8_8_ = (long)"Failed getting file size. fd is null" + 0x20;
    local_318._M_allocated_capacity = 4;
    literal::scan((region *)local_390,(literal *)local_328,loc);
    uVar3 = local_380._8_8_;
    uVar2 = local_390._8_8_;
    uVar1 = local_390._0_8_;
    if ((element_type *)local_390._0_8_ == (element_type *)0x0) {
      local_470._M_dataplus._M_p = (pointer)&local_470.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_470,"toml::parse_null: invalid null: null must be lowercase. ","")
      ;
      local_410.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_005688e0;
      local_410.value_ = "null";
      local_410.size_ = 4;
      location::location(&local_260,loc);
      local_490._M_dataplus._M_p = (pointer)&local_490.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_490,"");
      make_syntax_error<toml::detail::literal>
                ((error_info *)local_328,&local_470,&local_410,&local_260,&local_490);
      err<toml::error_info>(&local_d8,(error_info *)local_328);
      __return_storage_ptr__->is_ok_ = false;
      failure<toml::error_info>::failure
                ((failure<toml::error_info> *)&(__return_storage_ptr__->field_1).succ_,&local_d8);
      failure<toml::error_info>::~failure(&local_d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f0 != &local_2e0) {
        operator_delete((void *)local_2f0,(ulong)(local_2e0._M_allocated_capacity + 1));
      }
      std::
      vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector(&local_308);
      if ((undefined1 *)local_328._0_8_ != local_328 + 0x10) {
        operator_delete((void *)local_328._0_8_,(ulong)(local_318._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_490._M_dataplus._M_p != &local_490.field_2) {
        operator_delete(local_490._M_dataplus._M_p,local_490.field_2._M_allocated_capacity + 1);
      }
      location::~location(&local_260);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_470._M_dataplus._M_p != &local_470.field_2) {
        operator_delete(local_470._M_dataplus._M_p,local_470.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      pbVar4 = (basic_value<toml::type_config> *)(local_3f8 + 0x20);
      local_390._0_8_ = (element_type *)0x0;
      local_390._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if ((basic_value<toml::type_config> *)local_380._0_8_ ==
          (basic_value<toml::type_config> *)local_370) {
        local_3f8._40_8_ = local_370._8_8_;
        local_3f8._16_8_ = pbVar4;
      }
      else {
        local_3f8._16_8_ = local_380._0_8_;
      }
      local_3f8._33_7_ = local_370._1_7_;
      local_3f8[0x20] = local_370[0];
      local_380._8_8_ = 0;
      local_370[0] = '\0';
      local_3c8 = local_370._16_8_;
      puStack_3c0 = (undefined1 *)local_370._24_8_;
      local_3b8 = local_370._32_8_;
      _Stack_3b0._M_p = (pointer)local_370._40_8_;
      local_3a8 = local_370._48_8_;
      sStack_3a0 = local_370._56_8_;
      local_398 = local_370._64_8_;
      local_2d0._M_p = local_2c0;
      local_328._0_8_ = local_328._0_8_ & 0xffffffffffffff00;
      local_328._8_8_ = local_328._8_8_ & 0xffffffffffffff00;
      local_2e0._M_allocated_capacity = uVar1;
      local_3f8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_2e0._8_8_ = uVar2;
      local_3f8._0_8_ = (element_type *)0x0;
      if ((basic_value<toml::type_config> *)local_3f8._16_8_ == pbVar4) {
        local_2c0._8_8_ = local_3f8._40_8_;
        v = (basic_value<toml::type_config> *)local_3f8._16_8_;
      }
      else {
        local_2d0._M_p = (pointer)local_3f8._16_8_;
        v = (basic_value<toml::type_config> *)local_3f8._32_8_;
      }
      local_2c8 = uVar3;
      local_3f8._24_8_ = 0;
      local_3f8._32_8_ = (ulong)(uint7)local_370._1_7_ << 8;
      local_2c0._16_8_ = local_370._16_8_;
      local_2c0._24_8_ = local_370._24_8_;
      local_2c0._32_8_ = local_370._32_8_;
      local_2c0._40_8_ = local_370._40_8_;
      local_2c0._48_8_ = local_370._48_8_;
      local_2c0._56_8_ = local_370._56_8_;
      local_2c0._64_8_ = local_370._64_8_;
      local_2c0._72_8_ = (pointer)0x0;
      _Stack_270._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_268._M_p = (pointer)0x0;
      local_3f8._16_8_ = pbVar4;
      local_380._0_8_ = (basic_value<toml::type_config> *)local_370;
      ok<toml::basic_value<toml::type_config>>
                ((success<toml::basic_value<toml::type_config>_> *)&local_1a0,(toml *)local_328,v);
      __return_storage_ptr__->is_ok_ = true;
      pbVar4 = &local_1a0;
      basic_value<toml::type_config>::basic_value
                (&(__return_storage_ptr__->field_1).succ_.value,pbVar4);
      basic_value<toml::type_config>::cleanup(&local_1a0,(EVP_PKEY_CTX *)pbVar4);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_1a0.comments_.comments);
      region::~region(&local_1a0.region_);
      basic_value<toml::type_config>::cleanup
                ((basic_value<toml::type_config> *)local_328,(EVP_PKEY_CTX *)pbVar4);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_2c0 + 0x48));
      region::~region((region *)&local_2e0);
      region::~region((region *)local_3f8);
    }
    region::~region((region *)local_390);
  }
  return __return_storage_ptr__;
}

Assistant:

result<basic_value<TC>, error_info>
parse_null(location& loc, const context<TC>& ctx)
{
    const auto& spec = ctx.toml_spec();
    if( ! spec.ext_null_value)
    {
        return err(make_error_info("toml::parse_null: "
            "invalid spec: spec.ext_null_value must be true.",
            source_location(region(loc)), "here"));
    }

    // ----------------------------------------------------------------------
    // check syntax
    auto reg = syntax::null_value(spec).scan(loc);
    if( ! reg.is_ok())
    {
        return err(make_syntax_error("toml::parse_null: "
            "invalid null: null must be lowercase. ",
            syntax::null_value(spec), loc));
    }

    // ----------------------------------------------------------------------
    // it matches. gen value

    // ----------------------------------------------------------------------
    // no format info for boolean

    return ok(basic_value<TC>(detail::none_t{}, std::move(reg)));
}